

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::execAndiEa<(moira::Instr)60,(moira::Mode)5,(moira::Size)1>(Moira *this,u16 opcode)

{
  u16 uVar1;
  byte bVar2;
  u32 addr;
  u32 uVar3;
  u32 result;
  uint val;
  
  uVar1 = (this->queue).irc;
  readExt(this);
  addr = computeEA<(moira::Mode)5,(moira::Size)1,0ul>(this,opcode & 7);
  uVar3 = readM<(moira::MemSpace)1,(moira::Size)1,128ul>(this,addr);
  val = (byte)uVar1 ^ uVar3;
  bVar2 = (byte)val;
  (this->reg).sr.n = (bool)(bVar2 >> 7);
  (this->reg).sr.z = bVar2 == 0;
  (this->reg).sr.v = false;
  (this->reg).sr.c = false;
  uVar3 = (this->reg).pc;
  (this->reg).pc0 = uVar3;
  (this->queue).ird = (this->queue).irc;
  uVar3 = readM<(moira::MemSpace)2,(moira::Size)2,0ul>(this,uVar3 + 2);
  (this->queue).irc = (u16)uVar3;
  writeM<(moira::MemSpace)1,(moira::Size)1,5ul>(this,addr,val);
  return;
}

Assistant:

void
Moira::execAndiEa(u16 opcode)
{
    u32 ea, data, result;

    u32 src = readI<S>();
    int dst = _____________xxx(opcode);

    if (!readOp<M,S, STD_AE_FRAME>(dst, ea, data)) return;

    result = logic<I,S>(src, data);
    prefetch();

    writeOp <M,S, POLLIPL | REVERSE> (dst, ea, result);
}